

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O2

void __thiscall InvertDatabase::init_buffer(InvertDatabase *this,int num_class,int size)

{
  ulong uVar1;
  ulong uVar2;
  bool print_idlist;
  Itemset_S tmp;
  int local_4c [2];
  int local_44;
  value_type local_40;
  
  local_44 = num_class;
  std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::reserve
            (&this->_items,(long)size);
  uVar2 = 0;
  uVar1 = (ulong)(uint)size;
  if (size < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_4c[1] = 1;
    local_4c[0] = 0;
    std::make_shared<Itemset,int,int,int&,bool&>
              ((int *)&local_40,local_4c + 1,local_4c,(bool *)&local_44);
    Itemset::setitem(local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
                     (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar2]);
    std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::push_back
              (&this->_items,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void init_buffer(int num_class, int size) {
        _items.reserve(size);
        bool print_idlist = args->print_tidlist;

        for (int i = 0; i < size; i++) {
            Itemset_S tmp = make_shared<Itemset>(1, 0, num_class, print_idlist);
            tmp->setitem(0, backidx[i]);
            _items.push_back(tmp);
        }
    }